

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxFRandom::FxFRandom
          (FxFRandom *this,FRandom *r,FxExpression *mi,FxExpression *ma,FScriptPosition *pos)

{
  FxFloatCast *pFVar1;
  
  FxRandom::FxRandom(&this->super_FxRandom,r,(FxExpression *)0x0,(FxExpression *)0x0,pos,true);
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxRandom_00706550;
  if (ma != (FxExpression *)0x0 && mi != (FxExpression *)0x0) {
    pFVar1 = (FxFloatCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)r);
    FxFloatCast::FxFloatCast(pFVar1,mi);
    (this->super_FxRandom).min = (FxExpression *)pFVar1;
    pFVar1 = (FxFloatCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)mi);
    FxFloatCast::FxFloatCast(pFVar1,ma);
    (this->super_FxRandom).max = (FxExpression *)pFVar1;
  }
  (this->super_FxRandom).super_FxExpression.ValueType = (PType *)TypeFloat64;
  (this->super_FxRandom).super_FxExpression.ExprType = EFX_FRandom;
  return;
}

Assistant:

FxFRandom::FxFRandom(FRandom *r, FxExpression *mi, FxExpression *ma, const FScriptPosition &pos)
: FxRandom(r, nullptr, nullptr, pos, true)
{
	if (mi != nullptr && ma != nullptr)
	{
		min = new FxFloatCast(mi);
		max = new FxFloatCast(ma);
	}
	ValueType = TypeFloat64;
	ExprType = EFX_FRandom;
}